

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::BinaryAssertionExpr::serializeTo(BinaryAssertionExpr *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view sVar1;
  char *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  int local_50;
  void *local_48;
  int local_40;
  void *local_38;
  size_t local_30;
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff98);
  sVar1 = ast::toString(And);
  local_30 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
  ASTSerializer::write(this_00,local_40,local_38,(size_t)in_RDI[1]._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)this_00);
  ASTSerializer::write(in_RSI,local_50,local_48,in_RDI[2]._M_len);
  return;
}

Assistant:

void BinaryAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("left", left);
    serializer.write("right", right);
}